

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  size_t sVar1;
  byte c;
  ushort uVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  lws_tokenize_elem lVar8;
  byte *pbVar9;
  byte *pbVar10;
  void *pvVar11;
  uint uVar12;
  uint uVar13;
  uint __c;
  bool bVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  size_t sVar18;
  size_t local_70;
  char local_68;
  byte local_44;
  
  uVar2 = ts->flags;
  iVar7 = 0;
  uVar15 = 0;
  uVar5 = 0x2d;
  if ((uVar2 & 1) != 0) {
    uVar5 = uVar15;
  }
  uVar6 = 0x2e;
  if ((uVar2 & 0x10) != 0) {
    uVar6 = uVar15;
  }
  uVar12 = 0x2a;
  if ((uVar2 & 0x200) != 0) {
    uVar12 = uVar15;
  }
  uVar13 = 0x3d;
  if ((uVar2 >> 10 & 1) != 0) {
    uVar13 = uVar15;
  }
  ts->token = (char *)0x0;
  ts->token_len = 0;
  if (ts->len != 0) {
    bVar3 = (byte)(uVar2 >> 8);
    local_44 = bVar3 >> 2 & 1;
    local_68 = ((uVar2 >> 6 & 1) != 0) + -1;
    bVar14 = true;
    local_70 = 0;
    bVar4 = false;
    lVar16 = 0;
    pbVar9 = (byte *)ts->start;
    sVar18 = ts->len;
    do {
      uVar15 = (uint)lVar16;
      pbVar10 = pbVar9 + 1;
      ts->start = (char *)pbVar10;
      c = *pbVar9;
      sVar1 = sVar18 - 1;
      ts->len = sVar1;
      iVar7 = lws_check_byte_utf8((uchar)iVar7,c);
      if (iVar7 < 0) {
        return LWS_TOKZE_ERR_BROKEN_UTF8;
      }
      if (c == 0) break;
      uVar17 = (uint)c;
      if (bVar14) {
        __c = (uint)(char)c;
        if (((-1 < (char)(byte)uVar2) || (uVar15 == 1)) || (c != 0x23)) goto LAB_0010c7d3;
LAB_0010c7c9:
        bVar14 = false;
      }
      else {
        __c = (uint)c;
        if ((uVar17 != 0xd) && (__c = uVar17, uVar17 != 10)) goto LAB_0010c7c9;
LAB_0010c7d3:
        if (c < 0x23) {
          if ((0x100003600U >> ((ulong)c & 0x3f) & 1) != 0) {
            lVar8 = (*(code *)(&DAT_001402c0 + *(int *)(&DAT_001402c0 + lVar16 * 4)))();
            return lVar8;
          }
          if ((ulong)c != 0x22) goto LAB_0010c87d;
          if (uVar15 == 1) {
            return LWS_TOKZE_QUOTED_STRING;
          }
          if ((uVar2 & 4) != 0) {
            if (ts->delim == '\x01') {
              return LWS_TOKZE_ERR_COMMA_LIST;
            }
            ts->delim = '\x01';
          }
          ts->token = (char *)pbVar10;
          ts->token_len = 0;
          bVar14 = true;
          lVar16 = 1;
          local_70 = 0;
        }
        else {
LAB_0010c87d:
          if (((uVar15 & 0xfffffffe) == 2 && (uVar2 >> 10 & 1) == 0) && c == 0x3d) {
            if (local_68 == '\x01') {
              return LWS_TOKZE_ERR_NUM_ON_LHS;
            }
            return LWS_TOKZE_ERRS;
          }
          if (((uVar17 == 0x3a && (uVar15 & 0xfffffffe) == 2) & (byte)((uVar2 & 2) >> 1)) != 0) {
            return LWS_TOKZE_TOKEN_NAME_COLON;
          }
          if (((c == 0x2e) && ((uVar2 & 0x20) == 0)) && ((uVar15 == 2 && (local_68 == '\x01')))) {
            if (bVar4) {
              return LWS_TOKZE_ERR_MALFORMED_FLOAT;
            }
            local_70 = local_70 + 1;
            ts->token_len = local_70;
            bVar4 = true;
            lVar16 = 2;
            local_68 = '\x01';
LAB_0010ca53:
            bVar14 = true;
          }
          else {
            if (iVar7 == 0) {
              if ((uVar2 & 8) == 0) {
                if (0xe5 < (byte)(c + 0xa5) || 0xf5 < (byte)(c - 0x3a)) goto LAB_0010caad;
                if (((((byte)(__c == 0x3d & local_44 |
                             __c == 0x2a & bVar3 >> 1 | __c == 0x2e & (byte)(uVar2 >> 4) & 0xf |
                             __c == 0x2d & (byte)uVar2 | (c == 0x5f || (byte)(c + 0x9f) < 0x1a)) !=
                       1) || (uVar5 == __c)) || (uVar6 == __c)) || (uVar12 == __c))
                goto LAB_0010cac9;
joined_r0x0010cac3:
                if (uVar13 != __c) goto LAB_0010c91f;
              }
              else {
                pvVar11 = memchr("(),/:;<=>?@[\\]{}",__c,0x11);
                if (((char)c < '!') || (pvVar11 == (void *)0x0)) {
LAB_0010caad:
                  if ((uVar5 != __c) && ((uVar6 != __c && (uVar12 != __c))))
                  goto joined_r0x0010cac3;
                }
              }
LAB_0010cac9:
              if (((uVar2 >> 8 & 1) != 0) && (c == 0x2f)) goto LAB_0010c91f;
              if (uVar15 == 1) {
                local_70 = local_70 + 1;
                ts->token_len = local_70;
                bVar14 = true;
                lVar16 = 1;
                goto LAB_0010ca62;
              }
              if (1 < uVar15 - 2) {
                if ((uVar2 & 4) != 0) {
                  if (c != 0x2c) {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  if (ts->delim != '\x01') {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  ts->delim = '\x02';
                }
                ts->token = (char *)pbVar9;
                ts->token_len = 1;
                return LWS_TOKZE_DELIMITER;
              }
LAB_0010cb87:
              ts->start = (char *)pbVar9;
              ts->len = sVar18;
              goto LAB_0010cb93;
            }
LAB_0010c91f:
            if (uVar15 - 1 < 2) {
              local_70 = local_70 + 1;
            }
            else {
              if (uVar15 != 0) goto LAB_0010cb87;
              if ((uVar2 & 4) != 0) {
                if (ts->delim == '\x01') {
                  return LWS_TOKZE_ERR_COMMA_LIST;
                }
                ts->delim = '\x01';
              }
              ts->token = (char *)pbVar9;
              lVar16 = 2;
              local_70 = 1;
            }
            ts->token_len = local_70;
            bVar14 = true;
            if ((uVar2 & 0x40) == 0) {
              if (0xf5 < (byte)(c - 0x3a)) {
                if (local_68 < '\0') {
                  local_68 = '\x01';
                }
                goto LAB_0010ca53;
              }
              local_68 = '\0';
            }
          }
        }
      }
LAB_0010ca62:
      uVar15 = (uint)lVar16;
      pbVar9 = pbVar10;
      sVar18 = sVar1;
    } while (sVar1 != 0);
    if (iVar7 != 0) {
      return LWS_TOKZE_ERR_BROKEN_UTF8;
    }
    if (uVar15 == 1) {
      return LWS_TOKZE_ERR_UNTERM_STRING;
    }
    if (0xfffffffd < uVar15 - 4) {
LAB_0010cb93:
      if (local_68 == '\x01') {
        return LWS_TOKZE_FLOAT - (uint)!bVar4;
      }
      return LWS_TOKZE_TOKEN;
    }
  }
  if (((uVar2 & 4) == 0) || (lVar8 = LWS_TOKZE_ERR_COMMA_LIST, ts->delim != '\x02')) {
    lVar8 = LWS_TOKZE_ENDED;
  }
  return lVar8;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', d_star = '*', s_minus = '\0',
	     s_dot = '\0', s_star = '\0', d_eq = '=', s_eq = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}
	if (ts->flags & LWS_TOKENIZE_F_ASTERISK_NONTERM) {
		d_star = '\0';
		s_star = '*';
	}
	if (ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) {
		d_eq = '\0';
		s_eq = '=';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, (unsigned char)c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (!(ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) &&
		    c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot && c != s_star && c != s_eq) ||
		    c == d_minus || c == d_dot || c == d_star || c == d_eq
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}